

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

void __thiscall
HighsSymmetryDetection::markCellForRefinement(HighsSymmetryDetection *this,HighsInt cell)

{
  pointer puVar1;
  HighsInt local_c;
  
  if (((this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[cell] - cell != 1) &&
     (puVar1 = (this->cellInRefinementQueue).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start, puVar1[cell] == '\0')) {
    puVar1[cell] = '\x01';
    local_c = cell;
    std::vector<int,_std::allocator<int>_>::push_back(&this->refinementQueue,&local_c);
    std::
    push_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<int>>
              ((this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void HighsSymmetryDetection::markCellForRefinement(HighsInt cell) {
  if (cellSize(cell) == 1 || cellInRefinementQueue[cell]) return;

  cellInRefinementQueue[cell] = true;
  refinementQueue.push_back(cell);
  std::push_heap(refinementQueue.begin(), refinementQueue.end(),
                 std::greater<HighsInt>());
}